

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.h
# Opt level: O1

void __thiscall L13_3::BankAccount::~BankAccount(BankAccount *this)

{
  pointer pcVar1;
  
  (this->super_Account)._vptr_Account = (_func_int **)&PTR___cxa_pure_virtual_00134300;
  pcVar1 = (this->super_Account)._name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Account)._name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~BankAccount(){}